

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalUnixMakefileGenerator3.cxx
# Opt level: O0

void __thiscall
cmGlobalUnixMakefileGenerator3::WriteMainCMakefile(cmGlobalUnixMakefileGenerator3 *this)

{
  bool bVar1;
  byte bVar2;
  cmake *pcVar3;
  string *psVar4;
  reference pvVar5;
  cmLocalUnixMakefileGenerator3 *pcVar6;
  ostream *poVar7;
  LocalGeneratorVector *pLVar8;
  iterator iVar9;
  iterator iVar10;
  reference path;
  reference puVar11;
  pointer pcVar12;
  cmMakefile *pcVar13;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar14;
  string local_698;
  cmAlphaNum local_678;
  cmAlphaNum local_648;
  string local_618;
  string local_5f8;
  string *local_5d8;
  string *outfile;
  const_iterator __end2;
  const_iterator __begin2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_> *localGen_1;
  iterator __end1_2;
  iterator __begin1_2;
  LocalGeneratorVector *__range1_2;
  string tmpStr;
  string local_558;
  cmAlphaNum local_538;
  cmAlphaNum local_508;
  undefined1 local_4d8 [8];
  string check;
  string *f;
  iterator __end1_1;
  iterator __begin1_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1_1;
  cmLocalUnixMakefileGenerator3 *lg_1;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_468;
  const_iterator local_460;
  const_iterator local_458;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_450;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_448;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_440;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  new_end;
  cmake *cm;
  unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_> *localGen;
  iterator __end1;
  iterator __begin1;
  LocalGeneratorVector *__range1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  lfiles;
  cmLocalUnixMakefileGenerator3 *lg;
  cmAlphaNum local_388;
  undefined1 local_358 [8];
  string makefileName;
  undefined1 local_330 [8];
  cmGeneratedFileStream cmakefileStream;
  cmAlphaNum local_98;
  undefined1 local_68 [8];
  string cmakefileName;
  allocator<char> local_31;
  string local_30;
  cmGlobalUnixMakefileGenerator3 *local_10;
  cmGlobalUnixMakefileGenerator3 *this_local;
  
  local_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,"CMAKE_SUPPRESS_REGENERATION",&local_31);
  bVar1 = cmGlobalGenerator::GlobalSettingIsOn((cmGlobalGenerator *)this,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator(&local_31);
  if (!bVar1) {
    pcVar3 = cmGlobalGenerator::GetCMakeInstance((cmGlobalGenerator *)this);
    psVar4 = cmake::GetHomeOutputDirectory_abi_cxx11_(pcVar3);
    cmAlphaNum::cmAlphaNum(&local_98,psVar4);
    cmAlphaNum::cmAlphaNum((cmAlphaNum *)&cmakefileStream.field_0x260,"/CMakeFiles/Makefile.cmake");
    cmStrCat<>((string *)local_68,&local_98,(cmAlphaNum *)&cmakefileStream.field_0x260);
    cmGeneratedFileStream::cmGeneratedFileStream
              ((cmGeneratedFileStream *)local_330,(string *)local_68,false,None);
    bVar2 = std::ios::operator!((ios *)(local_330 + (long)*(_func_int **)((long)local_330 + -0x18)))
    ;
    if ((bVar2 & 1) == 0) {
      pcVar3 = cmGlobalGenerator::GetCMakeInstance((cmGlobalGenerator *)this);
      psVar4 = cmake::GetHomeOutputDirectory_abi_cxx11_(pcVar3);
      cmAlphaNum::cmAlphaNum(&local_388,psVar4);
      cmAlphaNum::cmAlphaNum((cmAlphaNum *)&lg,"/Makefile");
      cmStrCat<>((string *)local_358,&local_388,(cmAlphaNum *)&lg);
      pvVar5 = std::
               vector<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>
               ::operator[](&(this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.
                             LocalGenerators,0);
      pcVar6 = ::cm::
               static_reference_cast<cmLocalUnixMakefileGenerator3,_std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_0>
                         (pvVar5);
      cmLocalUnixMakefileGenerator3::WriteDisclaimer(pcVar6,(ostream *)local_330);
      poVar7 = std::operator<<((ostream *)local_330,"# The generator used is:\n");
      poVar7 = std::operator<<(poVar7,"set(CMAKE_DEPENDS_GENERATOR \"");
      (*(this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator._vptr_cmGlobalGenerator[3])
                (&lfiles.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      poVar7 = std::operator<<(poVar7,(string *)
                                      &lfiles.
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
      std::operator<<(poVar7,"\")\n\n");
      std::__cxx11::string::~string
                ((string *)
                 &lfiles.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&__range1);
      pLVar8 = &(this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.LocalGenerators;
      __end1 = std::
               vector<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>
               ::begin(pLVar8);
      localGen = (unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_> *)
                 std::
                 vector<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>
                 ::end(pLVar8);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end1,(__normal_iterator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_*,_std::vector<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>_>
                                         *)&localGen), bVar1) {
        puVar11 = __gnu_cxx::
                  __normal_iterator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_*,_std::vector<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>_>
                  ::operator*(&__end1);
        pcVar12 = std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>::
                  operator->(puVar11);
        pcVar13 = cmLocalGenerator::GetMakefile(pcVar12);
        pvVar14 = cmMakefile::GetListFiles_abi_cxx11_(pcVar13);
        ::cm::
        append<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_0>
                  ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&__range1,pvVar14);
        __gnu_cxx::
        __normal_iterator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_*,_std::vector<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>_>
        ::operator++(&__end1);
      }
      pcVar3 = cmGlobalGenerator::GetCMakeInstance((cmGlobalGenerator *)this);
      bVar1 = cmake::DoWriteGlobVerifyTarget(pcVar3);
      if (bVar1) {
        psVar4 = cmake::GetGlobVerifyScript_abi_cxx11_(pcVar3);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&__range1,psVar4);
        psVar4 = cmake::GetGlobVerifyStamp_abi_cxx11_(pcVar3);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&__range1,psVar4);
      }
      iVar9 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&__range1);
      iVar10 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&__range1);
      std::
      sort<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::less<std::__cxx11::string>>
                (iVar9._M_current,iVar10._M_current);
      local_448._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&__range1);
      local_450 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&__range1);
      local_440 = std::
                  unique<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                            (local_448,
                             (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              )local_450);
      __gnu_cxx::
      __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
      ::__normal_iterator<std::__cxx11::string*>
                ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                  *)&local_458,&local_440);
      local_468._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&__range1);
      __gnu_cxx::
      __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
      ::__normal_iterator<std::__cxx11::string*>
                ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                  *)&local_460,&local_468);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::erase((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&__range1,local_458,local_460);
      pvVar5 = std::
               vector<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>
               ::operator[](&(this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.
                             LocalGenerators,0);
      pcVar6 = ::cm::
               static_reference_cast<cmLocalUnixMakefileGenerator3,_std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_0>
                         (pvVar5);
      poVar7 = std::operator<<((ostream *)local_330,
                               "# The top level Makefile was generated from the following files:\n")
      ;
      poVar7 = std::operator<<(poVar7,"set(CMAKE_MAKEFILE_DEPENDS\n");
      std::operator<<(poVar7,"  \"CMakeCache.txt\"\n");
      __end1_1 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&__range1);
      f = (string *)
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&__range1);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end1_1,
                                (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 *)&f), bVar1) {
        path = __gnu_cxx::
               __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*(&__end1_1);
        poVar7 = std::operator<<((ostream *)local_330,"  \"");
        cmOutputConverter::MaybeRelativeToCurBinDir
                  ((string *)((long)&check.field_2 + 8),
                   &(pcVar6->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                    super_cmOutputConverter,path);
        poVar7 = std::operator<<(poVar7,(string *)(check.field_2._M_local_buf + 8));
        std::operator<<(poVar7,"\"\n");
        std::__cxx11::string::~string((string *)(check.field_2._M_local_buf + 8));
        __gnu_cxx::
        __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++(&__end1_1);
      }
      std::operator<<((ostream *)local_330,"  )\n\n");
      pcVar3 = cmGlobalGenerator::GetCMakeInstance((cmGlobalGenerator *)this);
      psVar4 = cmake::GetHomeOutputDirectory_abi_cxx11_(pcVar3);
      cmAlphaNum::cmAlphaNum(&local_508,psVar4);
      cmAlphaNum::cmAlphaNum(&local_538,"/CMakeFiles/cmake.check_cache");
      cmStrCat<>((string *)local_4d8,&local_508,&local_538);
      poVar7 = std::operator<<((ostream *)local_330,"# The corresponding makefile is:\n");
      poVar7 = std::operator<<(poVar7,"set(CMAKE_MAKEFILE_OUTPUTS\n");
      poVar7 = std::operator<<(poVar7,"  \"");
      cmOutputConverter::MaybeRelativeToCurBinDir
                (&local_558,
                 &(pcVar6->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                  super_cmOutputConverter,(string *)local_358);
      poVar7 = std::operator<<(poVar7,(string *)&local_558);
      poVar7 = std::operator<<(poVar7,"\"\n");
      poVar7 = std::operator<<(poVar7,"  \"");
      cmOutputConverter::MaybeRelativeToCurBinDir
                ((string *)((long)&tmpStr.field_2 + 8),
                 &(pcVar6->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                  super_cmOutputConverter,(string *)local_4d8);
      poVar7 = std::operator<<(poVar7,(string *)(tmpStr.field_2._M_local_buf + 8));
      std::operator<<(poVar7,"\"\n");
      std::__cxx11::string::~string((string *)(tmpStr.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)&local_558);
      std::operator<<((ostream *)local_330,"  )\n\n");
      poVar7 = std::operator<<((ostream *)local_330,"# Byproducts of CMake generate step:\n");
      std::operator<<(poVar7,"set(CMAKE_MAKEFILE_PRODUCTS\n");
      std::__cxx11::string::string((string *)&__range1_2);
      pLVar8 = &(this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.LocalGenerators;
      __end1_2 = std::
                 vector<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>
                 ::begin(pLVar8);
      localGen_1 = (unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_> *)
                   std::
                   vector<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>
                   ::end(pLVar8);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end1_2,
                                (__normal_iterator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_*,_std::vector<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>_>
                                 *)&localGen_1), bVar1) {
        puVar11 = __gnu_cxx::
                  __normal_iterator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_*,_std::vector<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>_>
                  ::operator*(&__end1_2);
        pcVar12 = std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>::
                  operator->(puVar11);
        pcVar13 = cmLocalGenerator::GetMakefile(pcVar12);
        pvVar14 = cmMakefile::GetOutputFiles_abi_cxx11_(pcVar13);
        __end2 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::begin(pvVar14);
        outfile = (string *)
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::end(pvVar14);
        while (bVar1 = __gnu_cxx::operator!=
                                 (&__end2,(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                           *)&outfile), bVar1) {
          local_5d8 = __gnu_cxx::
                      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ::operator*(&__end2);
          poVar7 = std::operator<<((ostream *)local_330,"  \"");
          cmOutputConverter::MaybeRelativeToTopBinDir
                    (&local_5f8,
                     &(pcVar6->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                      super_cmOutputConverter,local_5d8);
          poVar7 = std::operator<<(poVar7,(string *)&local_5f8);
          std::operator<<(poVar7,"\"\n");
          std::__cxx11::string::~string((string *)&local_5f8);
          __gnu_cxx::
          __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::operator++(&__end2);
        }
        pcVar12 = std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>::
                  operator->(puVar11);
        psVar4 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_(pcVar12);
        cmAlphaNum::cmAlphaNum(&local_648,psVar4);
        cmAlphaNum::cmAlphaNum(&local_678,"/CMakeFiles/CMakeDirectoryInformation.cmake");
        cmStrCat<>(&local_618,&local_648,&local_678);
        std::__cxx11::string::operator=((string *)&__range1_2,(string *)&local_618);
        std::__cxx11::string::~string((string *)&local_618);
        poVar7 = std::operator<<((ostream *)local_330,"  \"");
        pcVar12 = std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>::
                  operator->(puVar11);
        cmOutputConverter::MaybeRelativeToTopBinDir
                  (&local_698,&pcVar12->super_cmOutputConverter,(string *)&__range1_2);
        poVar7 = std::operator<<(poVar7,(string *)&local_698);
        std::operator<<(poVar7,"\"\n");
        std::__cxx11::string::~string((string *)&local_698);
        __gnu_cxx::
        __normal_iterator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_*,_std::vector<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>_>
        ::operator++(&__end1_2);
      }
      std::operator<<((ostream *)local_330,"  )\n\n");
      std::__cxx11::string::~string((string *)&__range1_2);
      std::__cxx11::string::~string((string *)local_4d8);
      WriteMainCMakefileLanguageRules
                (this,(cmGeneratedFileStream *)local_330,
                 &(this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.LocalGenerators);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&__range1);
      std::__cxx11::string::~string((string *)local_358);
      makefileName.field_2._12_4_ = 0;
    }
    else {
      makefileName.field_2._12_4_ = 1;
    }
    cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_330);
    std::__cxx11::string::~string((string *)local_68);
  }
  return;
}

Assistant:

void cmGlobalUnixMakefileGenerator3::WriteMainCMakefile()
{
  if (this->GlobalSettingIsOn("CMAKE_SUPPRESS_REGENERATION")) {
    return;
  }

  // Open the output file.  This should not be copy-if-different
  // because the check-build-system step compares the makefile time to
  // see if the build system must be regenerated.
  std::string cmakefileName =
    cmStrCat(this->GetCMakeInstance()->GetHomeOutputDirectory(),
             "/CMakeFiles/Makefile.cmake");
  cmGeneratedFileStream cmakefileStream(cmakefileName);
  if (!cmakefileStream) {
    return;
  }

  std::string makefileName =
    cmStrCat(this->GetCMakeInstance()->GetHomeOutputDirectory(), "/Makefile");

  {
    // get a local generator for some useful methods
    auto& lg = cm::static_reference_cast<cmLocalUnixMakefileGenerator3>(
      this->LocalGenerators[0]);

    // Write the do not edit header.
    lg.WriteDisclaimer(cmakefileStream);
  }

  // Save the generator name
  cmakefileStream << "# The generator used is:\n"
                  << "set(CMAKE_DEPENDS_GENERATOR \"" << this->GetName()
                  << "\")\n\n";

  // for each cmMakefile get its list of dependencies
  std::vector<std::string> lfiles;
  for (const auto& localGen : this->LocalGenerators) {
    // Get the list of files contributing to this generation step.
    cm::append(lfiles, localGen->GetMakefile()->GetListFiles());
  }

  cmake* cm = this->GetCMakeInstance();
  if (cm->DoWriteGlobVerifyTarget()) {
    lfiles.push_back(cm->GetGlobVerifyScript());
    lfiles.push_back(cm->GetGlobVerifyStamp());
  }

  // Sort the list and remove duplicates.
  std::sort(lfiles.begin(), lfiles.end(), std::less<std::string>());
#if !defined(__VMS) // The Compaq STL on VMS crashes, so accept duplicates.
  auto new_end = std::unique(lfiles.begin(), lfiles.end());
  lfiles.erase(new_end, lfiles.end());
#endif

  {
    // reset lg to the first makefile
    const auto& lg = cm::static_reference_cast<cmLocalUnixMakefileGenerator3>(
      this->LocalGenerators[0]);

    // Save the list to the cmake file.
    cmakefileStream
      << "# The top level Makefile was generated from the following files:\n"
      << "set(CMAKE_MAKEFILE_DEPENDS\n"
      << "  \"CMakeCache.txt\"\n";
    for (std::string const& f : lfiles) {
      cmakefileStream << "  \"" << lg.MaybeRelativeToCurBinDir(f) << "\"\n";
    }
    cmakefileStream << "  )\n\n";

    // Build the path to the cache check file.
    std::string check =
      cmStrCat(this->GetCMakeInstance()->GetHomeOutputDirectory(),
               "/CMakeFiles/cmake.check_cache");

    // Set the corresponding makefile in the cmake file.
    cmakefileStream << "# The corresponding makefile is:\n"
                    << "set(CMAKE_MAKEFILE_OUTPUTS\n"
                    << "  \"" << lg.MaybeRelativeToCurBinDir(makefileName)
                    << "\"\n"
                    << "  \"" << lg.MaybeRelativeToCurBinDir(check) << "\"\n";
    cmakefileStream << "  )\n\n";

    // CMake must rerun if a byproduct is missing.
    cmakefileStream << "# Byproducts of CMake generate step:\n"
                    << "set(CMAKE_MAKEFILE_PRODUCTS\n";

    // add in any byproducts and all the directory information files
    std::string tmpStr;
    for (const auto& localGen : this->LocalGenerators) {
      for (std::string const& outfile :
           localGen->GetMakefile()->GetOutputFiles()) {
        cmakefileStream << "  \"" << lg.MaybeRelativeToTopBinDir(outfile)
                        << "\"\n";
      }
      tmpStr = cmStrCat(localGen->GetCurrentBinaryDirectory(),
                        "/CMakeFiles/CMakeDirectoryInformation.cmake");
      cmakefileStream << "  \"" << localGen->MaybeRelativeToTopBinDir(tmpStr)
                      << "\"\n";
    }
    cmakefileStream << "  )\n\n";
  }

  this->WriteMainCMakefileLanguageRules(cmakefileStream,
                                        this->LocalGenerators);
}